

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O0

LY_ERR schema_mount_create_ctx
                 (lysc_ext_instance *ext,lyd_node *ext_data,ly_bool config,ly_ctx **ext_ctx)

{
  lys_module *search_dir;
  lyd_node *tree;
  uint16_t uVar1;
  lysc_node *local_70;
  lysc_node *LYSC_TREE_DFS_next;
  uint32_t local_60;
  uint uStack_5c;
  ly_bool LYSC_TREE_DFS_continue;
  uint32_t idx;
  uint32_t i;
  lysc_node *node;
  lysc_node *root;
  lys_module *mod;
  char *sdirs;
  char **searchdirs;
  ly_ctx **pplStack_28;
  LY_ERR rc;
  ly_ctx **ext_ctx_local;
  lyd_node *plStack_18;
  ly_bool config_local;
  lyd_node *ext_data_local;
  lysc_ext_instance *ext_local;
  
  searchdirs._4_4_ = 0;
  mod = (lys_module *)0x0;
  local_60 = 0;
  pplStack_28 = ext_ctx;
  ext_ctx_local._7_1_ = config;
  plStack_18 = ext_data;
  ext_data_local = (lyd_node *)ext;
  sdirs = (char *)ly_ctx_get_searchdirs(ext->module->ctx);
  if ((char **)sdirs != (char **)0x0) {
    uStack_5c = 0;
    while (*(long *)(sdirs + (ulong)uStack_5c * 8) != 0) {
      searchdirs._4_4_ =
           ly_strcat((char **)&mod,"%s:",*(undefined8 *)(sdirs + (ulong)uStack_5c * 8));
      if (searchdirs._4_4_ != LY_SUCCESS) goto LAB_00208b74;
      uStack_5c = uStack_5c + 1;
      searchdirs._4_4_ = 0;
    }
  }
  tree = plStack_18;
  search_dir = mod;
  uVar1 = ly_ctx_get_options(*(ly_ctx **)&ext_data_local->parent->field_0);
  searchdirs._4_4_ = ly_ctx_new_yldata((char *)search_dir,tree,(uint)uVar1,pplStack_28);
  if (searchdirs._4_4_ == LY_SUCCESS) {
    if (ext_ctx_local._7_1_ == '\0') {
      while (root = (lysc_node *)ly_ctx_get_module_iter(*pplStack_28,&local_60),
            (lys_module *)root != (lys_module *)0x0) {
        if (((lys_module *)root)->implemented != '\0') {
          for (node = ((lys_module *)root)->compiled->data; node != (lysc_node *)0x0;
              node = node->next) {
            _idx = node;
            while (_idx != (lysc_node *)0x0) {
              _idx->flags = _idx->flags & 0xfffe;
              _idx->flags = _idx->flags | 2;
              local_70 = lysc_node_child(_idx);
              if (local_70 == (lysc_node *)0x0) {
                if (_idx == node) break;
                local_70 = _idx->next;
              }
              while ((local_70 == (lysc_node *)0x0 && (_idx = _idx->parent, _idx != node))) {
                local_70 = _idx->next;
              }
              _idx = local_70;
            }
          }
        }
      }
      root = (lysc_node *)0x0;
    }
  }
  else {
    lyplg_ext_compile_log
              ((lysc_ctx *)0x0,(lysc_ext_instance *)ext_data_local,LY_LLERR,searchdirs._4_4_,
               "Failed to create context for the schema-mount data.");
  }
LAB_00208b74:
  free(mod);
  return searchdirs._4_4_;
}

Assistant:

static LY_ERR
schema_mount_create_ctx(const struct lysc_ext_instance *ext, const struct lyd_node *ext_data, ly_bool config,
        struct ly_ctx **ext_ctx)
{
    LY_ERR rc = LY_SUCCESS;
    const char * const *searchdirs;
    char *sdirs = NULL;
    const struct lys_module *mod;
    struct lysc_node *root, *node;
    uint32_t i, idx = 0;

    /* get searchdirs from the current context */
    searchdirs = ly_ctx_get_searchdirs(ext->module->ctx);

    if (searchdirs) {
        /* append them all into a single string */
        for (i = 0; searchdirs[i]; ++i) {
            if ((rc = ly_strcat(&sdirs, "%s" PATH_SEPARATOR, searchdirs[i]))) {
                goto cleanup;
            }
        }
    }

    /* create the context based on the data */
    if ((rc = ly_ctx_new_yldata(sdirs, ext_data, ly_ctx_get_options(ext->module->ctx), ext_ctx))) {
        lyplg_ext_compile_log(NULL, ext, LY_LLERR, rc, "Failed to create context for the schema-mount data.");
        goto cleanup;
    }

    if (!config) {
        /* manually change the config of all schema nodes in all the modules */
        while ((mod = ly_ctx_get_module_iter(*ext_ctx, &idx))) {
            if (!mod->implemented) {
                continue;
            }

            LY_LIST_FOR(mod->compiled->data, root) {
                LYSC_TREE_DFS_BEGIN(root, node) {
                    node->flags &= ~LYS_CONFIG_W;
                    node->flags |= LYS_CONFIG_R;

                    LYSC_TREE_DFS_END(root, node);
                }
            }
        }
    }

cleanup:
    free(sdirs);
    return rc;
}